

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldLiteGenerator::GenerateMembers
          (RepeatedImmutableStringFieldLiteGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.Internal.ProtobufList<java.lang.String> $name$_;\n"
                    );
  PrintExtraFieldInfo(variables,printer);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public java.util.List<java.lang.String> ${$get$capitalized_name$List$}$() {\n  return $name$_;\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_COUNT,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$(int index) {\n  return $name$_.get(index);\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldStringBytesAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_GETTER,false);
  io::Printer::Print(printer,variables,
                     "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$(int index) {\n  return com.google.protobuf.ByteString.copyFromUtf8(\n      $name$_.get(index));\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  io::Printer::Print(printer,variables,
                     "private void ensure$capitalized_name$IsMutable() {\n  com.google.protobuf.Internal.ProtobufList<java.lang.String> tmp =\n      $name$_;  if (!tmp.isModifiable()) {\n    $name$_ =\n        com.google.protobuf.GeneratedMessageLite.mutableCopy(tmp);\n   }\n}\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_SETTER,false);
  io::Printer::Print(printer,variables,
                     "private void set$capitalized_name$(\n    int index, java.lang.String value) {\n$null_check$  ensure$capitalized_name$IsMutable();\n  $name$_.set(index, value);\n}\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_ADDER,false);
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$(\n    java.lang.String value) {\n$null_check$  ensure$capitalized_name$IsMutable();\n  $name$_.add(value);\n}\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_MULTI_ADDER,false);
  io::Printer::Print(printer,variables,
                     "private void addAll$capitalized_name$(\n    java.lang.Iterable<java.lang.String> values) {\n  ensure$capitalized_name$IsMutable();\n  com.google.protobuf.AbstractMessageLite.addAll(\n      values, $name$_);\n}\n"
                    );
  WriteFieldAccessorDocComment(printer,this->descriptor_,CLEARER,false);
  io::Printer::Print(printer,variables,
                     "private void clear$capitalized_name$() {\n  $name$_ = $empty_list$;\n}\n");
  WriteFieldStringBytesAccessorDocComment(printer,this->descriptor_,LIST_ADDER,false);
  io::Printer::Print(printer,variables,
                     "private void add$capitalized_name$Bytes(\n    com.google.protobuf.ByteString value) {\n"
                    );
  if ((*(char *)(*(long *)(this->descriptor_ + 0x10) + 0x3a) == '\x03') ||
     (*(char *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x78) + 0x9a) == '\x01')) {
    io::Printer::Print(printer,variables,"  checkByteStringIsUtf8(value);\n");
  }
  io::Printer::Print(printer,variables,
                     "  ensure$capitalized_name$IsMutable();\n  $name$_.add(value.toStringUtf8());\n}\n"
                    );
  return;
}

Assistant:

void RepeatedImmutableStringFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private com.google.protobuf.Internal.ProtobufList<java.lang.String> "
      "$name$_;\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<java.lang.String> "
                 "${$get$capitalized_name$List$}$() {\n"
                 "  return $name$_;\n"  // note:  unmodifiable list
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.lang.String "
                 "${$get$capitalized_name$$}$(int index) {\n"
                 "  return $name$_.get(index);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldStringBytesAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$(int index) {\n"
                 "  return com.google.protobuf.ByteString.copyFromUtf8(\n"
                 "      $name$_.get(index));\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  printer->Print(
      variables_,
      "private void ensure$capitalized_name$IsMutable() {\n"
      // Use a temporary to avoid a redundant iget-object.
      "  com.google.protobuf.Internal.ProtobufList<java.lang.String> tmp =\n"
      "      $name$_;"
      "  if (!tmp.isModifiable()) {\n"
      "    $name$_ =\n"
      "        com.google.protobuf.GeneratedMessageLite.mutableCopy(tmp);\n"
      "   }\n"
      "}\n");

  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER);
  printer->Print(variables_,
                 "private void set$capitalized_name$(\n"
                 "    int index, java.lang.String value) {\n"
                 "$null_check$"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.set(index, value);\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER);
  printer->Print(variables_,
                 "private void add$capitalized_name$(\n"
                 "    java.lang.String value) {\n"
                 "$null_check$"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.add(value);\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER);
  printer->Print(variables_,
                 "private void addAll$capitalized_name$(\n"
                 "    java.lang.Iterable<java.lang.String> values) {\n"
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  com.google.protobuf.AbstractMessageLite.addAll(\n"
                 "      values, $name$_);\n"
                 "}\n");
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER);
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $name$_ = $empty_list$;\n"
                 "}\n");

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, LIST_ADDER);
  printer->Print(variables_,
                 "private void add$capitalized_name$Bytes(\n"
                 "    com.google.protobuf.ByteString value) {\n");
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "  checkByteStringIsUtf8(value);\n");
  }
  printer->Print(variables_,
                 "  ensure$capitalized_name$IsMutable();\n"
                 "  $name$_.add(value.toStringUtf8());\n"
                 "}\n");
}